

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_40(QPDF *pdf,char *arg2)

{
  QPDFWriter local_28 [8];
  QPDFWriter w;
  char *arg2_local;
  QPDF *pdf_local;
  
  if (arg2 != (char *)0x0) {
    QPDFWriter::QPDFWriter(local_28,pdf,arg2);
    QPDFWriter::setPCLm(SUB81(local_28,0));
    QPDFWriter::setStaticID(SUB81(local_28,0));
    QPDFWriter::write();
    QPDFWriter::~QPDFWriter(local_28);
    return;
  }
  __assert_fail("arg2 != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x565,"void test_40(QPDF &, const char *)");
}

Assistant:

static void
test_40(QPDF& pdf, char const* arg2)
{
    // Write PCLm. This requires specially crafted PDF files. This
    // feature was implemented by Sahil Arora
    // <sahilarora.535@gmail.com> as part of a Google Summer of
    // Code project in 2017.
    assert(arg2 != nullptr);
    QPDFWriter w(pdf, arg2);
    w.setPCLm(true);
    w.setStaticID(true);
    w.write();
}